

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t::event_queue_impl_t
          (event_queue_impl_t *this,main_thread_sync_objects_t *sync_objects)

{
  main_thread_sync_objects_t *sync_objects_local;
  event_queue_impl_t *this_local;
  
  event_queue_t::event_queue_t(&this->super_event_queue_t);
  (this->super_event_queue_t)._vptr_event_queue_t = (_func_int **)&PTR__event_queue_impl_t_005c29c0;
  this->m_sync_objects = sync_objects;
  std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::deque
            (&this->m_demands);
  return;
}

Assistant:

event_queue_impl_t( main_thread_sync_objects_t & sync_objects )
			:	m_sync_objects( sync_objects )
			{}